

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

Extra_SymmInfo_t * Extra_SymmPairsAllocate(int nVars)

{
  Extra_SymmInfo_t *__s;
  int *piVar1;
  char **ppcVar2;
  char *pcVar3;
  Extra_SymmInfo_t *p;
  int i;
  int nVars_local;
  
  __s = (Extra_SymmInfo_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->nVars = nVars;
  piVar1 = (int *)malloc((long)nVars << 2);
  __s->pVars = piVar1;
  ppcVar2 = (char **)malloc((long)nVars << 3);
  __s->pSymms = ppcVar2;
  pcVar3 = (char *)malloc((long)(nVars * nVars));
  *__s->pSymms = pcVar3;
  memset(*__s->pSymms,0,(long)(nVars * nVars));
  for (p._0_4_ = 1; (int)p < nVars; p._0_4_ = (int)p + 1) {
    __s->pSymms[(int)p] = __s->pSymms[(int)p + -1] + nVars;
  }
  return __s;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsAllocate( int nVars )
{
    int i;
    Extra_SymmInfo_t * p;

    // allocate and clean the storage for symmetry info
    p = ABC_ALLOC( Extra_SymmInfo_t, 1 );
    memset( p, 0, sizeof(Extra_SymmInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( int, nVars );  
    p->pSymms    = ABC_ALLOC( char *, nVars );  
    p->pSymms[0] = ABC_ALLOC( char  , nVars * nVars );
    memset( p->pSymms[0], 0, nVars * nVars * sizeof(char) );

    for ( i = 1; i < nVars; i++ )
        p->pSymms[i] = p->pSymms[i-1] + nVars;

    return p;
}